

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O1

int uv_udp_init(uv_loop_t *loop,uv_udp_t *handle)

{
  long *plVar1;
  
  handle->loop = loop;
  handle->type = UV_UDP;
  handle->flags = 0x2000;
  handle->handle_queue[0] = loop->handle_queue;
  plVar1 = (long *)loop->handle_queue[1];
  handle->handle_queue[1] = plVar1;
  *plVar1 = (long)handle->handle_queue;
  loop->handle_queue[1] = handle->handle_queue;
  handle->next_closing = (uv_handle_t *)0x0;
  handle->send_queue_size = 0;
  handle->send_queue_count = 0;
  handle->alloc_cb = (uv_alloc_cb)0x0;
  handle->recv_cb = (uv_udp_recv_cb)0x0;
  uv__io_init(&handle->io_watcher,uv__udp_io,-1);
  handle->write_queue[0] = handle->write_queue;
  handle->write_queue[1] = handle->write_queue;
  handle->write_completed_queue[0] = handle->write_completed_queue;
  handle->write_completed_queue[1] = handle->write_completed_queue;
  return 0;
}

Assistant:

int uv_udp_init(uv_loop_t* loop, uv_udp_t* handle) {
  return uv_udp_init_ex(loop, handle, AF_UNSPEC);
}